

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmExtb<(moira::Instr)155,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Av<(moira::Instr)155,_(moira::Mode)0,_4> local_38;
  int local_34;
  int local_30;
  Dn local_28;
  u16 local_22;
  Dn src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _src = addr;
  Dn::Dn(&local_28,op & 7);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  local_30 = (str->tab).raw;
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_30);
  local_34 = local_28.raw;
  StrWriter::operator<<(pSVar1,local_28);
  local_38.ext1 = 0;
  StrWriter::operator<<(str,&local_38);
  return;
}

Assistant:

void
Moira::dasmExtb(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn ( _____________xxx(op) );

    str << Ins<I>{} << Sz<S>{} << str.tab << Dn{src};
    str << Av<I, M, S>{};
}